

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

int Acec_TreeVerifyPhaseOne_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint local_40;
  uint local_3c;
  int Truth1;
  int Truth0;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0xf7,"int Acec_TreeVerifyPhaseOne_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjIsXor(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Gia_ObjIsXor(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0xf8,"int Acec_TreeVerifyPhaseOne_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    local_3c = Acec_TreeVerifyPhaseOne_rec(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    local_40 = Acec_TreeVerifyPhaseOne_rec(p,pGVar2);
    iVar1 = Gia_ObjFaninC0(pObj);
    if (iVar1 != 0) {
      local_3c = (local_3c ^ 0xffffffff) & 0xff;
    }
    iVar1 = Gia_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_40 = (local_40 ^ 0xffffffff) & 0xff;
    }
    p_local._4_4_ = local_3c & local_40;
    pObj->Value = p_local._4_4_;
  }
  else {
    p_local._4_4_ = pObj->Value;
  }
  return p_local._4_4_;
}

Assistant:

int Acec_TreeVerifyPhaseOne_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Truth0, Truth1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return pObj->Value;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsXor(pObj) );
    Truth0 = Acec_TreeVerifyPhaseOne_rec( p, Gia_ObjFanin0(pObj) );
    Truth1 = Acec_TreeVerifyPhaseOne_rec( p, Gia_ObjFanin1(pObj) );
    Truth0 = Gia_ObjFaninC0(pObj) ? 0xFF & ~Truth0 : Truth0;
    Truth1 = Gia_ObjFaninC1(pObj) ? 0xFF & ~Truth1 : Truth1;
    return (pObj->Value = Truth0 & Truth1);
}